

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

uint64_t __thiscall
poplar::
map<poplar::compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
::alloc_bytes(map<poplar::compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
              *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  uVar1 = compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          ::alloc_bytes(&this->hash_trie_);
  uVar2 = compact_bonsai_nlm<int,_16UL>::alloc_bytes(&this->label_store_);
  return uVar1 + 0x100 + uVar2;
}

Assistant:

uint64_t alloc_bytes() const {
        uint64_t bytes = 0;
        bytes += hash_trie_.alloc_bytes();
        bytes += label_store_.alloc_bytes();
        bytes += codes_.size();
        return bytes;
    }